

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

string * __thiscall
testing::internal::FormatCompilerIndependentFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  char *__s;
  allocator<char> local_21;
  String local_20;
  
  __s = "unknown file";
  if (this != (internal *)0x0) {
    __s = (char *)this;
  }
  if ((int)file < 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_20);
  }
  else {
    String::Format((char *)&local_20,"%s:%d");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,local_20.c_str_,&local_21);
    String::~String(&local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ::std::string FormatCompilerIndependentFileLocation(
    const char* file, int line) {
  const char* const file_name = file == NULL ? kUnknownFile : file;

  if (line < 0)
    return file_name;
  else
    return String::Format("%s:%d", file_name, line).c_str();
}